

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FSpecialAction,_FSpecialAction>::DoCopy
          (TArray<FSpecialAction,_FSpecialAction> *this,
          TArray<FSpecialAction,_FSpecialAction> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  FSpecialAction *pFVar4;
  undefined8 uVar5;
  FSpecialAction *pFVar6;
  long lVar7;
  ulong uVar8;
  
  uVar3 = other->Count;
  this->Count = uVar3;
  this->Most = uVar3;
  if ((ulong)uVar3 == 0) {
    this->Array = (FSpecialAction *)0x0;
  }
  else {
    pFVar6 = (FSpecialAction *)
             M_Malloc_Dbg((ulong)uVar3 * 0x1c,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                          ,0x19e);
    this->Array = pFVar6;
    if (this->Count != 0) {
      lVar7 = 4;
      uVar8 = 0;
      do {
        pFVar6 = this->Array;
        pFVar4 = other->Array;
        *(undefined4 *)((long)pFVar6->Args + lVar7 + -0xc) =
             *(undefined4 *)((long)pFVar4->Args + lVar7 + -0xc);
        *(undefined8 *)((long)pFVar6->Args + lVar7 + 8) =
             *(undefined8 *)((long)pFVar4->Args + lVar7 + 8);
        puVar1 = (undefined8 *)((long)pFVar4->Args + lVar7 + -8);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pFVar6->Args + lVar7 + -8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x1c;
      } while (uVar8 < this->Count);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}